

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict post_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  short sVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  node_t_conflict pnVar5;
  node *arg;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  node_t_conflict op2;
  int token_code;
  char *expected_name;
  parse_ctx_t parse_ctx;
  pos_t p;
  pos_t pVar8;
  undefined8 local_48;
  char *local_40;
  
  ppVar3 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar3->curr_token == 0x103) {
    arg = ppVar3->curr_token->node;
    read_token(c2m_ctx);
  }
  else {
    ptVar4 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar4 == 0x100) {
      arg = ptVar4->node;
      read_token(c2m_ctx);
    }
    else {
      ptVar4 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar4 == 0x101) {
        arg = ptVar4->node;
        read_token(c2m_ctx);
      }
      else {
        ptVar4 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar4 == 0x102) {
          arg = ptVar4->node;
          read_token(c2m_ctx);
        }
        else {
          ptVar4 = c2m_ctx->parse_ctx->curr_token;
          sVar1 = *(short *)ptVar4;
          if (sVar1 == 0x10a) {
            local_40 = (ptVar4->pos).fname;
            local_48._0_4_ = (ptVar4->pos).lno;
            local_48._4_4_ = (ptVar4->pos).ln_pos;
            read_token(c2m_ctx);
          }
          ptVar4 = c2m_ctx->parse_ctx->curr_token;
          sVar2 = *(short *)ptVar4;
          if (sVar1 == 0x10a) {
            if (sVar2 == 0x103) {
              pnVar5 = ptVar4->node;
              read_token(c2m_ctx);
              p.lno = (undefined4)local_48;
              p.ln_pos = local_48._4_4_;
              p.fname = local_40;
              arg = new_pos_node1(c2m_ctx,N_LABEL_ADDR,p,pnVar5);
              goto LAB_00199123;
            }
            arg = &err_struct;
            if (ppVar3->record_level != 0) goto LAB_00199123;
            expected_name = "identifier";
          }
          else {
            if (sVar2 == 0x28) {
              read_token(c2m_ctx);
              if (*(short *)ppVar3->curr_token == 0x7b) {
                pnVar6 = compound_stmt(c2m_ctx,no_err_p);
                arg = &err_struct;
                if (pnVar6 == &err_struct) goto LAB_00199123;
                pnVar5 = new_node(c2m_ctx,N_STMTEXPR);
                op_append(c2m_ctx,pnVar5,pnVar6);
              }
              else {
                pnVar5 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
                arg = &err_struct;
                if (pnVar5 == &err_struct) goto LAB_00199123;
              }
              if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
                read_token(c2m_ctx);
                arg = pnVar5;
              }
              else {
                arg = &err_struct;
              }
              goto LAB_00199123;
            }
            if (sVar2 == 0x115) {
              local_40 = (ptVar4->pos).fname;
              local_48._0_4_ = (ptVar4->pos).lno;
              local_48._4_4_ = (ptVar4->pos).ln_pos;
              read_token(c2m_ctx);
            }
            arg = &err_struct;
            if (sVar2 != 0x115) goto LAB_00199123;
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
              read_token(c2m_ctx);
              pnVar5 = right_op(c2m_ctx,no_err_p,0x104,0x3d,cond_expr,assign_expr);
              arg = &err_struct;
              if (pnVar5 == &err_struct) goto LAB_00199123;
              if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c) {
                read_token(c2m_ctx);
                pnVar6 = new_node(c2m_ctx,N_LIST);
                pnVar5 = new_node2(c2m_ctx,N_GENERIC,pnVar5,pnVar6);
                pVar8.lno = (undefined4)local_48;
                pVar8.ln_pos = local_48._4_4_;
                pVar8.fname = local_40;
                add_pos(c2m_ctx,pnVar5,pVar8);
                arg = &err_struct;
                while( true ) {
                  ptVar4 = c2m_ctx->parse_ctx->curr_token;
                  if (*(short *)ptVar4 == 0x120) {
                    pVar8 = ptVar4->pos;
                    read_token(c2m_ctx);
                    pnVar7 = new_node(c2m_ctx,N_IGNORE);
                  }
                  else {
                    pnVar7 = type_name(c2m_ctx,no_err_p);
                    if (pnVar7 == &err_struct) goto LAB_00199123;
                    pVar8 = get_node_pos(c2m_ctx,pnVar7);
                  }
                  if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3a) {
                    if (ppVar3->record_level != 0) goto LAB_00199123;
                    token_code = 0x3a;
                    goto LAB_001994ee;
                  }
                  read_token(c2m_ctx);
                  op2 = right_op(c2m_ctx,no_err_p,0x104,0x3d,cond_expr,assign_expr);
                  if (op2 == &err_struct) goto LAB_00199123;
                  pnVar7 = new_node2(c2m_ctx,N_GENERIC_ASSOC,pnVar7,op2);
                  add_pos(c2m_ctx,pnVar7,pVar8);
                  op_append(c2m_ctx,pnVar6,pnVar7);
                  sVar1 = *(short *)c2m_ctx->parse_ctx->curr_token;
                  if (sVar1 != 0x2c) break;
                  read_token(c2m_ctx);
                }
                if (sVar1 == 0x29) {
                  read_token(c2m_ctx);
                  arg = pnVar5;
                  goto LAB_00199123;
                }
                if (ppVar3->record_level != 0) goto LAB_00199123;
                token_code = 0x29;
              }
              else {
                if (ppVar3->record_level != 0) goto LAB_00199123;
                token_code = 0x2c;
              }
            }
            else {
              if (ppVar3->record_level != 0) goto LAB_00199123;
              token_code = 0x28;
            }
LAB_001994ee:
            expected_name = get_token_name(c2m_ctx,token_code);
          }
          syntax_error(c2m_ctx,expected_name);
          arg = &err_struct;
        }
      }
    }
  }
LAB_00199123:
  if (arg == &err_struct) {
    return &err_struct;
  }
  pnVar5 = post_expr_part(c2m_ctx,no_err_p,arg);
  return pnVar5;
}

Assistant:

D (post_expr) {
  node_t r;

  P (primary_expr);
  PA (post_expr_part, r);
  return r;
}